

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::SplitProgramFromArgs(string *path,string *program,string *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string local_120 [32];
  ulong local_100;
  size_type pos_1;
  string local_d8 [32];
  ulong local_b8;
  size_type pos;
  string tryProg;
  size_type spacePos;
  string dir;
  undefined1 local_58 [8];
  string findProg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  e;
  string *args_local;
  string *program_local;
  string *path_local;
  
  bVar1 = FileExists(path);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)program,(string *)path);
    std::__cxx11::string::operator=((string *)args,"");
  }
  else {
    this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&findProg.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this);
    FindProgram((string *)local_58,path,this,false);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator=((string *)program,(string *)local_58);
      std::__cxx11::string::operator=((string *)args,"");
      dir.field_2._8_4_ = 1;
    }
    else {
      std::__cxx11::string::string((string *)&spacePos,(string *)path);
      tryProg.field_2._8_8_ = std::__cxx11::string::rfind((char)&spacePos,0x20);
      do {
        if (tryProg.field_2._8_8_ == -1) {
          std::__cxx11::string::operator=((string *)program,"");
          std::__cxx11::string::operator=((string *)args,"");
          dir.field_2._8_4_ = 0;
          break;
        }
        std::__cxx11::string::substr((ulong)&pos,(ulong)&spacePos);
        bVar1 = FileExists((string *)&pos);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)program,(string *)&pos);
          local_b8 = std::__cxx11::string::size();
          while( true ) {
            local_b8 = local_b8 - 1;
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)program);
            if (*pcVar3 != ' ') break;
            std::__cxx11::string::erase((ulong)program,local_b8);
          }
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_d8,(ulong)&spacePos);
          std::__cxx11::string::operator=((string *)args,local_d8);
          std::__cxx11::string::~string(local_d8);
          dir.field_2._8_4_ = 1;
        }
        else {
          FindProgram((string *)&pos_1,(string *)&pos,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&findProg.field_2 + 8),false);
          std::__cxx11::string::operator=((string *)local_58,(string *)&pos_1);
          std::__cxx11::string::~string((string *)&pos_1);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            std::__cxx11::string::operator=((string *)program,(string *)local_58);
            local_100 = std::__cxx11::string::size();
            while( true ) {
              local_100 = local_100 - 1;
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)program);
              if (*pcVar3 != ' ') break;
              std::__cxx11::string::erase((ulong)program,local_100);
            }
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_120,(ulong)&spacePos);
            std::__cxx11::string::operator=((string *)args,local_120);
            std::__cxx11::string::~string(local_120);
            dir.field_2._8_4_ = 1;
          }
          else {
            tryProg.field_2._8_8_ = tryProg.field_2._8_8_ + -1;
            tryProg.field_2._8_8_ = std::__cxx11::string::rfind((char)&spacePos,0x20);
            dir.field_2._8_4_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)&pos);
      } while (dir.field_2._8_4_ == 0);
      std::__cxx11::string::~string((string *)&spacePos);
    }
    std::__cxx11::string::~string((string *)local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&findProg.field_2 + 8));
  }
  return;
}

Assistant:

void SystemTools::SplitProgramFromArgs(const std::string& path,
                                       std::string& program, std::string& args)
{
  // see if this is a full path to a program
  // if so then set program to path and args to nothing
  if (SystemTools::FileExists(path)) {
    program = path;
    args = "";
    return;
  }
  // Try to find the program in the path, note the program
  // may have spaces in its name so we have to look for it
  std::vector<std::string> e;
  std::string findProg = SystemTools::FindProgram(path, e);
  if (!findProg.empty()) {
    program = findProg;
    args = "";
    return;
  }

  // Now try and peel off space separated chunks from the end of the string
  // so the largest path possible is found allowing for spaces in the path
  std::string dir = path;
  std::string::size_type spacePos = dir.rfind(' ');
  while (spacePos != std::string::npos) {
    std::string tryProg = dir.substr(0, spacePos);
    // See if the file exists
    if (SystemTools::FileExists(tryProg)) {
      program = tryProg;
      // remove trailing spaces from program
      std::string::size_type pos = program.size() - 1;
      while (program[pos] == ' ') {
        program.erase(pos);
        pos--;
      }
      args = dir.substr(spacePos, dir.size() - spacePos);
      return;
    }
    // Now try and find the program in the path
    findProg = SystemTools::FindProgram(tryProg, e);
    if (!findProg.empty()) {
      program = findProg;
      // remove trailing spaces from program
      std::string::size_type pos = program.size() - 1;
      while (program[pos] == ' ') {
        program.erase(pos);
        pos--;
      }
      args = dir.substr(spacePos, dir.size() - spacePos);
      return;
    }
    // move past the space for the next search
    spacePos--;
    spacePos = dir.rfind(' ', spacePos);
  }

  program = "";
  args = "";
}